

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

void (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
               (int err,char *message,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path)

{
  ostream *poVar1;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [36];
  errno_erc local_1cc;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1c8;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_local;
  char *message_local;
  int err_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,message);
  poVar1 = std::operator<<(poVar1,' ');
  _Var2 = pstore::quoted(path);
  local_1b8[0]._M_string = _Var2._M_string;
  local_1c8._8_2_ = _Var2._8_2_;
  local_1b8[0]._M_delim = local_1c8._M_delim;
  local_1b8[0]._M_escape = local_1c8._M_escape;
  local_1c8 = _Var2;
  std::__detail::operator<<(poVar1,local_1b8);
  pstore::errno_erc::errno_erc(&local_1cc,err);
  std::__cxx11::ostringstream::str();
  pstore::raise<pstore::errno_erc,std::__cxx11::string>(local_1cc,local_1f0);
}

Assistant:

PSTORE_NO_RETURN void raise_file_error (int const err, MessageStr const message,
                                            PathStr const path) {
        std::ostringstream str;
        str << message << ' ' << pstore::quoted (path);
        raise (pstore::errno_erc{err}, str.str ());
    }